

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

size_t mz_zip_mem_read_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  size_t __n;
  ulong uVar1;
  
  uVar1 = *pOpaque - file_ofs;
  if (n <= uVar1) {
    uVar1 = n;
  }
  __n = 0;
  if (file_ofs < *pOpaque) {
    __n = uVar1;
  }
  memcpy(pBuf,(void *)(file_ofs + *(long *)(*(long *)((long)pOpaque + 0x68) + 0x80)),__n);
  return __n;
}

Assistant:

static size_t mz_zip_mem_read_func(void *pOpaque, mz_uint64 file_ofs,
                                   void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  size_t s = (file_ofs >= pZip->m_archive_size)
                 ? 0
                 : (size_t)MZ_MIN(pZip->m_archive_size - file_ofs, n);
  memcpy(pBuf, (const mz_uint8 *)pZip->m_pState->m_pMem + file_ofs, s);
  return s;
}